

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension.cc
# Opt level: O1

void anon_unknown.dwarf_48e28::PrintCountAndSize
               (MallocExtensionWriter *writer,uintptr_t count,uintptr_t size)

{
  char local_88 [8];
  char buf [100];
  
  snprintf(local_88,100,"%6lu: %8lu [%6lu: %8lu] @",count,size,count,size);
  strlen(local_88);
  std::__cxx11::string::append((char *)writer,(ulong)local_88);
  return;
}

Assistant:

void PrintCountAndSize(MallocExtensionWriter* writer,
                       uintptr_t count, uintptr_t size) {
  char buf[100];
  snprintf(buf, sizeof(buf),
           "%6" PRIu64 ": %8" PRIu64 " [%6" PRIu64 ": %8" PRIu64 "] @",
           static_cast<uint64_t>(count),
           static_cast<uint64_t>(size),
           static_cast<uint64_t>(count),
           static_cast<uint64_t>(size));
  writer->append(buf, strlen(buf));
}